

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

void CopyBlock32b(uint32_t *dst,int dist,int length)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *__src;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  __src = (ulong *)(dst + -(long)dist);
  if (((((ulong)dst & 3) == 0) && (dist < 3)) && (3 < length)) {
    if (dist == 1) {
      uVar1 = (uint)*__src;
      uVar3 = CONCAT44(uVar1,uVar1);
      uVar4 = (ulong)uVar1;
    }
    else {
      uVar3 = *__src;
      uVar4 = uVar3;
    }
    if (((ulong)dst & 4) != 0) {
      __src = (ulong *)((long)__src + 4);
      *dst = (uint32_t)uVar4;
      dst = dst + 1;
      uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
      length = length - 1;
    }
    auVar2 = _DAT_001b6660;
    lVar7 = (ulong)((uint)length >> 1) - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_001b6660;
    auVar6 = _DAT_001b6470;
    do {
      auVar8 = auVar6 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(ulong *)(dst + uVar4 * 2) = uVar3;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(ulong *)(dst + uVar4 * 2 + 2) = uVar3;
      }
      uVar4 = uVar4 + 2;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
    } while ((((uint)length >> 1) + 1 & 0xfffffffe) != uVar4);
    if ((length & 1U) != 0) {
      dst[(int)(length & 0xfffffffe)] =
           *(uint *)((long)__src + (long)(int)(length & 0xfffffffe) * 4);
      return;
    }
  }
  else {
    if (length <= dist) {
      memcpy(dst,__src,(long)length << 2);
      return;
    }
    if (0 < length) {
      uVar3 = (ulong)(uint)length;
      do {
        *dst = dst[-(long)dist];
        dst = dst + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void CopyBlock32b(uint32_t* const dst,
                                     int dist, int length) {
  const uint32_t* const src = dst - dist;
  if (dist <= 2 && length >= 4 && ((uintptr_t)dst & 3) == 0) {
    uint64_t pattern;
    if (dist == 1) {
      pattern = (uint64_t)src[0];
      pattern |= pattern << 32;
    } else {
      memcpy(&pattern, src, sizeof(pattern));
    }
    CopySmallPattern32b(src, dst, length, pattern);
  } else if (dist >= length) {  // no overlap
    memcpy(dst, src, length * sizeof(*dst));
  } else {
    int i;
    for (i = 0; i < length; ++i) dst[i] = src[i];
  }
}